

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O0

void __thiscall echo_server::echo_server(echo_server *this,epoll *ep)

{
  echo_server *local_68;
  code *local_60;
  undefined8 local_58;
  type local_50;
  on_connected_t local_38;
  epoll *local_18;
  epoll *ep_local;
  echo_server *this_local;
  
  this->ep = ep;
  local_60 = on_new_connection;
  local_58 = 0;
  local_68 = this;
  local_18 = ep;
  ep_local = (epoll *)this;
  std::bind<void(echo_server::*)(),echo_server*>
            (&local_50,(offset_in_echo_server_to_subr *)&local_60,&local_68);
  std::function<void()>::function<std::_Bind<void(echo_server::*(echo_server*))()>,void>
            ((function<void()> *)&local_38,&local_50);
  server_socket::server_socket(&this->ss,ep,&local_38);
  std::function<void_()>::~function(&local_38);
  std::
  map<echo_server::connection_*,_std::unique_ptr<echo_server::connection,_std::default_delete<echo_server::connection>_>,_std::less<echo_server::connection_*>,_std::allocator<std::pair<echo_server::connection_*const,_std::unique_ptr<echo_server::connection,_std::default_delete<echo_server::connection>_>_>_>_>
  ::map(&this->connections);
  return;
}

Assistant:

echo_server::echo_server(epoll& ep)
    : ep(ep)
    , ss{ep, std::bind(&echo_server::on_new_connection, this)}
{}